

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::value(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        *__return_storage_ptr__,
       SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *this)

{
  double a;
  SPxSense SVar1;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *vec;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar2;
  cpp_dec_float<50U,_int,_void> *v;
  long in_FS_OFFSET;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> vv;
  cpp_dec_float<50U,_int,_void> local_198;
  cpp_dec_float<50U,_int,_void> local_158;
  cpp_dec_float<50U,_int,_void> local_118;
  cpp_dec_float<50U,_int,_void> local_d8;
  cpp_dec_float<50U,_int,_void> local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  v = &local_198;
  local_198.data._M_elems._32_5_ = 0;
  local_198.data._M_elems[9]._1_3_ = 0;
  local_198.exp = 0;
  local_198.neg = false;
  local_198.data._M_elems[4] = 0;
  local_198.data._M_elems[5] = 0;
  local_198.data._M_elems._24_5_ = 0;
  local_198.data._M_elems[7]._1_3_ = 0;
  local_198.data._M_elems[0] = 0;
  local_198.data._M_elems[1] = 0;
  local_198.data._M_elems[2] = 0;
  local_198.data._M_elems[3] = 0;
  if (this->initialized == false) {
    ::soplex::infinity::__tls_init();
    a = *(double *)(in_FS_OFFSET + -8);
    (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
    (__return_storage_ptr__->m_backend).prec_elem = 10;
    (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
    *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x1d) = 0;
    *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x25) = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)__return_storage_ptr__,a);
    return __return_storage_ptr__;
  }
  if (this->theRep == ROW) {
    if (this->theType == LEAVE) {
      SVar1 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thesense;
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator*((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)&local_158,
                  &this->theCoPvec->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,this->theFrhs);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_d8,(long)SVar1,(type *)0x0);
      goto LAB_00233467;
    }
    SVar1 = (this->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thesense;
    nonbasicValue(&local_68,this);
    vec = this->theFrhs;
    this_00 = this->theCoPvec;
  }
  else {
    SVar1 = (this->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thesense;
    nonbasicValue(&local_68,this);
    this_00 = this->theFvec;
    vec = this->theCoPrhs;
  }
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator*((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_a0,
              &this_00->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,vec);
  local_158.data._M_elems[8] = local_68.m_backend.data._M_elems[8];
  local_158.data._M_elems[9] = local_68.m_backend.data._M_elems[9];
  local_158.data._M_elems[4] = local_68.m_backend.data._M_elems[4];
  local_158.data._M_elems[5] = local_68.m_backend.data._M_elems[5];
  local_158.data._M_elems[6] = local_68.m_backend.data._M_elems[6];
  local_158.data._M_elems[7] = local_68.m_backend.data._M_elems[7];
  local_158.data._M_elems[0] = local_68.m_backend.data._M_elems[0];
  local_158.data._M_elems[1] = local_68.m_backend.data._M_elems[1];
  local_158.data._M_elems[2] = local_68.m_backend.data._M_elems[2];
  local_158.data._M_elems[3] = local_68.m_backend.data._M_elems[3];
  local_158.exp = local_68.m_backend.exp;
  local_158.neg = local_68.m_backend.neg;
  local_158.fpclass = local_68.m_backend.fpclass;
  local_158.prec_elem = local_68.m_backend.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=(&local_158,&local_a0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_d8,(long)SVar1,(type *)0x0);
LAB_00233467:
  local_118.exp = local_158.exp;
  local_118.neg = local_158.neg;
  local_118.fpclass = local_158.fpclass;
  local_118.prec_elem = local_158.prec_elem;
  local_118.data._M_elems[0] = local_158.data._M_elems[0];
  local_118.data._M_elems[1] = local_158.data._M_elems[1];
  local_118.data._M_elems[2] = local_158.data._M_elems[2];
  local_118.data._M_elems[3] = local_158.data._M_elems[3];
  local_118.data._M_elems[4] = local_158.data._M_elems[4];
  local_118.data._M_elems[5] = local_158.data._M_elems[5];
  local_118.data._M_elems[6] = local_158.data._M_elems[6];
  local_118.data._M_elems[7] = local_158.data._M_elems[7];
  local_118.data._M_elems._32_8_ = local_158.data._M_elems._32_8_;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_118,&local_d8);
  local_198.data._M_elems[1] = local_118.data._M_elems[1];
  local_198.data._M_elems[0] = local_118.data._M_elems[0];
  local_198.data._M_elems[3] = local_118.data._M_elems[3];
  local_198.data._M_elems[2] = local_118.data._M_elems[2];
  local_198.data._M_elems[5] = local_118.data._M_elems[5];
  local_198.data._M_elems[4] = local_118.data._M_elems[4];
  local_198.data._M_elems._24_5_ =
       SUB85(CONCAT44(local_118.data._M_elems[7],local_118.data._M_elems[6]),0);
  local_198.data._M_elems[7]._1_3_ = (undefined3)(local_118.data._M_elems[7] >> 8);
  local_198.data._M_elems._32_5_ = local_118.data._M_elems._32_5_;
  local_198.data._M_elems[9]._1_3_ = local_118.data._M_elems[9]._1_3_;
  local_198.exp = local_118.exp;
  local_198.neg = local_118.neg;
  local_198.fpclass = local_118.fpclass;
  local_198.prec_elem = local_118.prec_elem;
  pnVar2 = &(this->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).offset;
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 10;
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x25) = 0;
  if ((pnVar2 != __return_storage_ptr__) &&
     (v = &pnVar2->m_backend, &local_198 != &__return_storage_ptr__->m_backend)) {
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
         local_118.data._M_elems._32_8_;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
         local_198.data._M_elems._16_8_;
    *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
         CONCAT35(local_198.data._M_elems[7]._1_3_,local_198.data._M_elems._24_5_);
    *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems = local_198.data._M_elems._0_8_
    ;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
         local_198.data._M_elems._8_8_;
    (__return_storage_ptr__->m_backend).exp = local_118.exp;
    (__return_storage_ptr__->m_backend).neg = local_118.neg;
    (__return_storage_ptr__->m_backend).fpclass = local_118.fpclass;
    (__return_storage_ptr__->m_backend).prec_elem = local_118.prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
            (&__return_storage_ptr__->m_backend,v);
  return __return_storage_ptr__;
}

Assistant:

R SPxSolverBase<R>::value()
   {
      assert(isInitialized());

      R x;

      // calling value() without having a suitable status is an error.
      if(!isInitialized())
         return R(infinity);

      if(rep() == ROW)
      {
         if(type() == LEAVE)
            x = int(SPxLPBase<R>::spxSense()) * (coPvec() *
                                                 fRhs()); // the contribution of maxRowObj() is missing
         else
            x = int(SPxLPBase<R>::spxSense()) * (nonbasicValue() + (coPvec() * fRhs()));
      }
      else
         x = int(SPxLPBase<R>::spxSense()) * (nonbasicValue() + fVec() * coPrhs());

      return x + this->objOffset();
   }